

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O2

void zzMulWMod(word *b,word *a,word w,word *mod,size_t n,void *stack)

{
  word *pwVar1;
  word wVar2;
  
  pwVar1 = (word *)((long)stack + n * 8);
  wVar2 = zzMulW((word *)stack,a,n,w);
  *pwVar1 = wVar2;
  zzMod(b,(word *)stack,n + 1,mod,n,pwVar1 + 1);
  return;
}

Assistant:

void zzMulWMod(word b[], const word a[], register word w, const word mod[],
	size_t n, void* stack)
{
	word* prod = (word*)stack;
	stack = prod + n + 1;
	ASSERT(wwCmp(a, mod, n) < 0);
	ASSERT(wwIsValid(b, n));
	ASSERT(n > 0 && mod[n - 1] != 0);
	prod[n] = zzMulW(prod, a, n, w);
	zzMod(b, prod, n + 1, mod, n, stack);
}